

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

void menu_ensure_cursor_valid(menu_conflict *m)

{
  _Bool _Var1;
  int local_1c;
  int local_14;
  int count;
  int row;
  menu_conflict *m_local;
  
  if (m->filter_list == (int *)0x0) {
    local_1c = m->count;
  }
  else {
    local_1c = m->filter_count;
  }
  local_14 = m->cursor;
  while( true ) {
    if (local_1c <= local_14) {
      m->cursor = local_1c + -1;
      return;
    }
    _Var1 = is_valid_row(m,local_14);
    if (_Var1) break;
    local_14 = local_14 + 1;
  }
  m->cursor = local_14;
  return;
}

Assistant:

void menu_ensure_cursor_valid(struct menu *m)
{
	int row;
	int count = m->filter_list ? m->filter_count : m->count;

	for (row = m->cursor; row < count; row++) {
		if (is_valid_row(m, row)) {
			m->cursor = row;
			return;
		}
	}

	/* If we've run off the end, without finding a valid row, put cursor
	 * on the last row */
	m->cursor = count - 1;
}